

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::map_reader_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_map *tmap)

{
  ostream *poVar1;
  t_type *ptVar2;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  undefined1 local_1e8 [8];
  string val;
  undefined1 local_1b8 [8];
  string desc;
  ostringstream out;
  t_map *tmap_local;
  t_st_generator *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(desc.field_2._M_local_buf + 8));
  temp_name_abi_cxx11_((string *)local_1b8,this);
  temp_name_abi_cxx11_((string *)local_1e8,this);
  poVar1 = std::operator<<((ostream *)((long)&desc.field_2 + 8),"[|");
  poVar1 = std::operator<<(poVar1,(string *)local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)local_1e8);
  poVar1 = std::operator<<(poVar1,"| ");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&desc.field_2 + 8),(string *)&local_208);
  poVar1 = std::operator<<(poVar1,(string *)local_1b8);
  poVar1 = std::operator<<(poVar1," := iprot readMapBegin.");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_228);
  poVar1 = std::operator<<(poVar1,(string *)local_1e8);
  poVar1 = std::operator<<(poVar1," := Dictionary new.");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_248);
  poVar1 = std::operator<<(poVar1,(string *)local_1b8);
  poVar1 = std::operator<<(poVar1," size timesRepeat: [");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&desc.field_2 + 8),(string *)&local_268);
  poVar1 = std::operator<<(poVar1,(string *)local_1e8);
  poVar1 = std::operator<<(poVar1," at: ");
  ptVar2 = t_map::get_key_type(tmap);
  read_val_abi_cxx11_(&local_288,this,ptVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_288);
  poVar1 = std::operator<<(poVar1," put: ");
  ptVar2 = t_map::get_val_type(tmap);
  read_val_abi_cxx11_(&local_2a8,this,ptVar2);
  std::operator<<(poVar1,(string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  t_generator::indent_down((t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&desc.field_2 + 8),"].");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2c8);
  poVar1 = std::operator<<(poVar1,"iprot readMapEnd.");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2e8,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2e8);
  poVar1 = std::operator<<(poVar1,(string *)local_1e8);
  std::operator<<(poVar1,"] value");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  t_generator::indent_down((t_generator *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(desc.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::map_reader(t_map* tmap) {
  std::ostringstream out;
  string desc = temp_name();
  string val = temp_name();

  out << "[|" << desc << " " << val << "| " << endl;
  indent_up();

  out << indent() << desc << " := iprot readMapBegin." << endl << indent() << val
      << " := Dictionary new." << endl << indent() << desc << " size timesRepeat: [" << endl;

  indent_up();
  out << indent() << val << " at: " << read_val(tmap->get_key_type())
      << " put: " << read_val(tmap->get_val_type());
  indent_down();

  out << "]." << endl << indent() << "iprot readMapEnd." << endl << indent() << val << "] value";
  indent_down();

  return out.str();
}